

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_api_v2.c
# Opt level: O1

MPP_RET hal_vp8e_init(void *hal,MppEncHalCfg *cfg)

{
  bool bVar1;
  bool bVar2;
  RK_U32 RVar3;
  MPP_RET MVar4;
  undefined8 in_RAX;
  void *pvVar5;
  MppClientType MVar6;
  MppEncHalApi *pMVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  *(undefined8 *)hal = 0;
  *(undefined8 *)((long)hal + 8) = 0;
  bVar2 = false;
  mpp_env_get_u32("vp8e_hal_debug",&vp8e_hal_debug,0);
  RVar3 = mpp_get_vcodec_type();
  bVar1 = true;
  if ((RVar3 >> 0x12 & 1) == 0) {
    if ((RVar3 >> 0x11 & 1) == 0) {
      pMVar7 = (MppEncHalApi *)0x0;
      _mpp_log_l(2,"hal_vp8e_api_v2","Failed to init due to unsupported hard mode, hw_flag = %d\n",
                 "hal_vp8e_init",(ulong)RVar3);
      MVar6 = VPU_CLIENT_BUTT;
      bVar2 = true;
      bVar1 = false;
    }
    else {
      MVar6 = VPU_CLIENT_VEPU1;
      pMVar7 = &hal_vp8e_vepu1;
      bVar2 = false;
    }
  }
  else {
    MVar6 = VPU_CLIENT_VEPU2;
    pMVar7 = &hal_vp8e_vepu2;
  }
  MVar4 = MPP_ERR_INIT;
  if (bVar1) {
    if (bVar2) {
      uVar8 = CONCAT44(uVar9,0x42);
      _mpp_log_l(2,"hal_vp8e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p_api",
                 "hal_vp8e_init",uVar8);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00269c21:
        abort();
      }
      if (bVar2) {
        _mpp_log_l(2,"hal_vp8e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "type != VPU_CLIENT_BUTT","hal_vp8e_init",
                   CONCAT44((int)((ulong)uVar8 >> 0x20),0x43));
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00269c21;
      }
    }
    pvVar5 = mpp_osal_calloc("hal_vp8e_init",(ulong)pMVar7->ctx_size);
    if (pvVar5 != (void *)0x0) {
      *(void **)((long)hal + 8) = pvVar5;
      *(MppEncHalApi **)hal = pMVar7;
      cfg->type = MVar6;
      MVar4 = (*pMVar7->init)(pvVar5,cfg);
      return MVar4;
    }
    MVar4 = MPP_ERR_MALLOC;
  }
  return MVar4;
}

Assistant:

static MPP_RET hal_vp8e_init(void *hal, MppEncHalCfg *cfg)
{
    const MppEncHalApi  *p_api = NULL;
    Halvp8eCtx *ctx = (Halvp8eCtx *)hal;
    MppClientType type = VPU_CLIENT_BUTT;
    void* hw_ctx = NULL;

    memset(ctx, 0, sizeof(Halvp8eCtx));

    mpp_env_get_u32("vp8e_hal_debug", &vp8e_hal_debug, 0);

    {
        RK_U32 hw_flag = mpp_get_vcodec_type();
        if (hw_flag & HAVE_VEPU2) {
            p_api = &hal_vp8e_vepu2;
            type = VPU_CLIENT_VEPU2;
        } else if (hw_flag & HAVE_VEPU1) {
            p_api = &hal_vp8e_vepu1;
            type = VPU_CLIENT_VEPU1;
        } else {
            mpp_err_f("Failed to init due to unsupported hard mode, hw_flag = %d\n", hw_flag);
            return MPP_ERR_INIT;
        }
    }

    mpp_assert(p_api);
    mpp_assert(type != VPU_CLIENT_BUTT);

    hw_ctx = mpp_calloc_size(void, p_api->ctx_size);
    if (NULL == hw_ctx)
        return MPP_ERR_MALLOC;

    ctx->hw_ctx = hw_ctx;
    ctx->api = p_api;
    cfg->type = type;

    return p_api->init(hw_ctx, cfg);
}